

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::weakly_canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  reference p_00;
  path local_198;
  path local_178;
  path local_158;
  path local_138;
  undefined1 local_118 [8];
  error_code tec;
  path pe;
  undefined1 local_e0 [8];
  iterator __end2;
  iterator __begin2;
  path *__range2;
  undefined1 local_40 [7];
  bool scan;
  path result;
  error_code *ec_local;
  path *p_local;
  
  result._path.field_2._8_8_ = ec;
  path::path((path *)local_40);
  std::error_code::clear((error_code *)result._path.field_2._8_8_);
  bVar2 = true;
  path::begin((iterator *)((long)&__end2._current._path.field_2 + 8),p);
  path::end((iterator *)local_e0,p);
  while (bVar1 = path::iterator::operator!=
                           ((iterator *)((long)&__end2._current._path.field_2 + 8),
                            (iterator *)local_e0), bVar1) {
    p_00 = path::iterator::operator*((iterator *)((long)&__end2._current._path.field_2 + 8));
    path::path((path *)&tec._M_cat,p_00);
    if (bVar2) {
      std::error_code::error_code((error_code *)local_118);
      operator/(&local_138,(path *)local_40,(path *)&tec._M_cat);
      bVar1 = exists(&local_138,(error_code *)local_118);
      path::~path(&local_138);
      if (bVar1) {
        path::operator/=((path *)local_40,(path *)&tec._M_cat);
        goto LAB_0026ad94;
      }
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)result._path.field_2._8_8_);
      if (!bVar1) {
        bVar2 = false;
        bVar1 = path::empty((path *)local_40);
        if (bVar1) {
          path::operator/=((path *)local_40,(path *)&tec._M_cat);
        }
        else {
          canonical(&local_178,(path *)local_40,(error_code *)result._path.field_2._8_8_);
          operator/(&local_158,&local_178,(path *)&tec._M_cat);
          path::operator=((path *)local_40,&local_158);
          path::~path(&local_158);
          path::~path(&local_178);
          bVar1 = std::error_code::operator_cast_to_bool((error_code *)result._path.field_2._8_8_);
          if (bVar1) {
            pe._path.field_2._12_4_ = 2;
            goto LAB_0026ad9e;
          }
        }
        goto LAB_0026ad94;
      }
      path::path(__return_storage_ptr__);
      pe._path.field_2._12_4_ = 1;
    }
    else {
      path::operator/=((path *)local_40,(path *)&tec._M_cat);
LAB_0026ad94:
      pe._path.field_2._12_4_ = 0;
    }
LAB_0026ad9e:
    path::~path((path *)&tec._M_cat);
    if (pe._path.field_2._12_4_ != 0) goto LAB_0026adcb;
    path::iterator::operator++((iterator *)((long)&__end2._current._path.field_2 + 8));
  }
  pe._path.field_2._12_4_ = 2;
LAB_0026adcb:
  path::iterator::~iterator((iterator *)local_e0);
  path::iterator::~iterator((iterator *)((long)&__end2._current._path.field_2 + 8));
  if (pe._path.field_2._12_4_ == 2) {
    if ((bVar2) && (bVar2 = path::empty((path *)local_40), !bVar2)) {
      canonical(&local_198,(path *)local_40,(error_code *)result._path.field_2._8_8_);
      path::operator=((path *)local_40,&local_198);
      path::~path(&local_198);
    }
    bVar2 = std::error_code::operator_cast_to_bool((error_code *)result._path.field_2._8_8_);
    if (bVar2) {
      path::path(__return_storage_ptr__);
    }
    else {
      path::lexically_normal(__return_storage_ptr__,(path *)local_40);
    }
  }
  path::~path((path *)local_40);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path weakly_canonical(const path& p, std::error_code& ec) noexcept
{
    path result;
    ec.clear();
    bool scan = true;
    for (auto pe : p) {
        if (scan) {
            std::error_code tec;
            if (exists(result / pe, tec)) {
                result /= pe;
            }
            else {
                if (ec) {
                    return path();
                }
                scan = false;
                if (!result.empty()) {
                    result = canonical(result, ec) / pe;
                    if (ec) {
                        break;
                    }
                }
                else {
                    result /= pe;
                }
            }
        }
        else {
            result /= pe;
        }
    }
    if (scan) {
        if (!result.empty()) {
            result = canonical(result, ec);
        }
    }
    return ec ? path() : result.lexically_normal();
}